

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

ArchKind llvm::ARM::parseArch(StringRef Arch)

{
  ArchKind AVar1;
  ulong uVar2;
  int iVar3;
  size_t in_RDX;
  ulong __n;
  long lVar4;
  bool bVar5;
  StringRef SVar6;
  
  SVar6.Data = (char *)Arch.Length;
  SVar6.Length = in_RDX;
  SVar6 = getCanonicalArchName((ARM *)Arch.Data,SVar6);
  SVar6 = getArchSynonym(SVar6);
  __n = SVar6.Length;
  lVar4 = 0;
  while( true ) {
    uVar2 = *(ulong *)(&DAT_001d76f8 + lVar4);
    AVar1 = *(ArchKind *)(&DAT_001d7728 + lVar4);
    bVar5 = __n <= uVar2;
    if (__n - 1 < uVar2) {
      iVar3 = bcmp((void *)((uVar2 + *(long *)((long)&(anonymous_namespace)::ARCHNames + lVar4)) -
                           __n),SVar6.Data,__n);
      bVar5 = iVar3 == 0;
    }
    if (bVar5) break;
    lVar4 = lVar4 + 0x40;
    if (lVar4 == 0x840) {
      return INVALID;
    }
  }
  return AVar1;
}

Assistant:

ARM::ArchKind ARM::parseArch(StringRef Arch) {
  Arch = getCanonicalArchName(Arch);
  StringRef Syn = getArchSynonym(Arch);
  for (const auto A : ARCHNames) {
    if (A.getName().endswith(Syn))
      return A.ID;
  }
  return ARM::ArchKind::INVALID;
}